

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListModeViewBase::doStaticLayout(QListModeViewBase *this,QListViewLayoutInfo *info)

{
  Representation *pRVar1;
  QList<int> *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  QListView *pQVar5;
  QListViewPrivate *pQVar6;
  QAbstractItemModel *pQVar7;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  bool bVar8;
  undefined1 auVar9 [12];
  Representation RVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  char cVar15;
  Flow FVar16;
  QPoint QVar17;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar18;
  QSize *pQVar19;
  QSize QVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  QListViewLayoutInfo *pQVar24;
  Representation RVar25;
  Representation RVar26;
  Representation RVar27;
  int iVar28;
  QSize *pQVar29;
  long in_FS_OFFSET;
  bool bVar30;
  undefined1 auVar31 [16];
  Bucket BVar32;
  ulong local_1c0;
  ulong local_190;
  QModelIndex local_148;
  QPoint local_128;
  undefined8 uStack_120;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_118;
  QStyleOptionViewItem local_108;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar29 = &info->grid;
  pRVar1 = &(info->grid).ht;
  bVar30 = ((info->grid).ht.m_i | (info->grid).wd.m_i) < 0;
  QVar17 = initStaticLayout(this,info);
  memset(&local_108,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(&local_108);
  pQVar5 = (this->super_QCommonListViewBase).qq;
  (**(code **)(*(long *)&(pQVar5->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x2f8))(pQVar5,&local_108);
  uVar11 = (info->bounds).x1;
  uVar12 = (info->bounds).y1;
  uVar13 = (info->bounds).x2;
  uVar14 = (info->bounds).y2;
  auVar9._8_4_ = uVar14;
  auVar9._4_4_ = uVar13;
  iVar21 = info->spacing;
  local_108.super_QStyleOption.rect.x1.m_i = uVar11 + iVar21;
  local_108.super_QStyleOption.rect.y1.m_i = uVar12 + iVar21;
  auVar9._0_4_ = uVar12 - iVar21;
  auVar31._0_8_ = auVar9._0_8_ << 0x20;
  auVar31._8_4_ = uVar13 - iVar21;
  auVar31._12_4_ = uVar14 - iVar21;
  local_108.super_QStyleOption.rect._8_8_ = auVar31._8_8_;
  FVar16 = info->flow;
  if (FVar16 == LeftToRight) {
    lVar22 = 8;
    local_1c0 = (ulong)QVar17 & 0xffffffff;
    pQVar19 = (QSize *)pRVar1;
    pQVar24 = info;
    local_190 = (ulong)QVar17 >> 0x20;
  }
  else {
    lVar22 = 0xc;
    pQVar19 = pQVar29;
    pQVar24 = (QListViewLayoutInfo *)&(info->bounds).y1;
    local_190 = (ulong)QVar17 & 0xffffffff;
    pQVar29 = (QSize *)pRVar1;
    local_1c0 = (ulong)QVar17 >> 0x20;
  }
  iVar21 = (pQVar19->wd).m_i;
  iVar23 = iVar21;
  if (bVar30) {
    iVar23 = (this->super_QCommonListViewBase).batchSavedDeltaSeg;
  }
  iVar28 = info->last;
  if (info->first <= iVar28) {
    iVar2 = (pQVar24->bounds).x1.m_i;
    iVar3 = *(int *)((long)&(info->bounds).x1.m_i + lVar22);
    iVar4 = (pQVar29->wd).m_i;
    this_00 = &this->flowPositions;
    RVar10.m_i = info->first;
    do {
      pQVar6 = (this->super_QCommonListViewBase).dd;
      local_148.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_148.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      local_148._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      pQVar7 = (pQVar6->super_QAbstractItemViewPrivate).model;
      QPersistentModelIndex::operator_cast_to_QModelIndex
                ((QModelIndex *)&local_128,&(pQVar6->super_QAbstractItemViewPrivate).root);
      (**(code **)(*(long *)pQVar7 + 0x60))
                (&local_148,pQVar7,RVar10.m_i,0,(QModelIndex *)&local_128);
      auVar31 = (undefined1  [16])local_148._0_16_;
      local_118.ptr = local_148.m.ptr;
      local_128.xp.m_i = local_148.r;
      local_128.yp.m_i = local_148.c;
      uStack_120 = local_148.i;
      this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)((pQVar6->super_QAbstractItemViewPrivate).model + 8) + 0x90);
      RVar27.m_i = (int)local_1c0;
      local_148._0_16_ = auVar31;
      if (this_01 ==
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) {
LAB_00571184:
        if (bVar30) {
          pQVar6 = (this->super_QCommonListViewBase).dd;
          pQVar7 = (pQVar6->super_QAbstractItemViewPrivate).model;
          iVar21 = pQVar6->column;
          QPersistentModelIndex::operator_cast_to_QModelIndex
                    ((QModelIndex *)&local_128,&(pQVar6->super_QAbstractItemViewPrivate).root);
          (**(code **)(*(long *)pQVar7 + 0x60))
                    (&local_148,pQVar7,RVar10.m_i,iVar21,(QModelIndex *)&local_128);
          QVar20 = QListViewPrivate::itemSize
                             ((this->super_QCommonListViewBase).dd,&local_108,&local_148);
          RVar25 = QVar20.wd.m_i;
          RVar26.m_i = QVar20.ht.m_i.m_i;
          if (info->flow != LeftToRight) {
            RVar26.m_i = RVar25.m_i;
            RVar25.m_i = QVar20.ht.m_i.m_i;
          }
          iVar4 = RVar25.m_i + info->spacing;
          iVar21 = RVar26.m_i + info->spacing;
        }
        iVar28 = iVar4 + RVar27.m_i;
        if ((info->wrap == true) && ((iVar3 - iVar2) + 1 <= iVar28)) {
          local_128.xp.m_i = RVar27.m_i;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&this->segmentExtents,(this->segmentExtents).d.size,
                     (int *)&local_128);
          QList<int>::end(&this->segmentExtents);
          local_128.xp.m_i = (int)local_190 + iVar23 + info->spacing;
          local_190 = (ulong)(uint)local_128.xp.m_i;
          RVar27.m_i = info->spacing + iVar2;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&this->segmentPositions,(this->segmentPositions).d.size,
                     (int *)&local_128);
          QList<int>::end(&this->segmentPositions);
          local_128.xp.m_i = RVar10.m_i;
          QtPrivate::QPodArrayOps<int>::emplace<int&>
                    ((QPodArrayOps<int> *)&this->segmentStartRows,(this->segmentStartRows).d.size,
                     (int *)&local_128);
          QList<int>::end(&this->segmentStartRows);
          iVar28 = RVar27.m_i + iVar4;
          iVar23 = 0;
        }
        local_128.xp.m_i = (int)(this->flowPositions).d.size;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)&this->scrollValueMap,(this->scrollValueMap).d.size,
                   (int *)&local_128);
        QList<int>::end(&this->scrollValueMap);
        local_128.xp.m_i = RVar27.m_i;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)this_00,(this->flowPositions).d.size,(int *)&local_128);
        QList<int>::end(this_00);
        if (iVar23 < iVar21) {
          iVar23 = iVar21;
        }
        local_1c0 = (ulong)(uint)(iVar28 + info->spacing);
      }
      else {
        BVar32 = QHashPrivate::
                 Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                 ::findBucket<QtPrivate::QModelIndexWrapper>
                           (this_01,(QModelIndexWrapper *)&local_128);
        if ((BVar32.span[BVar32.index] == (Span)0xff) || (*(long *)(BVar32.span + 0x80) == 0))
        goto LAB_00571184;
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_128,&local_148)
        ;
        this_02 = (pQVar6->hiddenRows).q_hash.d;
        if (this_02 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0) {
          QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_128);
          goto LAB_00571184;
        }
        pNVar18 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                  findNode<QPersistentModelIndex>(this_02,(QPersistentModelIndex *)&local_128);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_128);
        if (pNVar18 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0) goto LAB_00571184;
        local_128.xp.m_i = RVar27.m_i;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)this_00,(this->flowPositions).d.size,(int *)&local_128);
        QList<int>::end(this_00);
      }
      iVar28 = info->last;
      bVar8 = RVar10.m_i < iVar28;
      RVar10.m_i = RVar10.m_i + 1;
    } while (bVar8);
    FVar16 = info->flow;
  }
  this->batchSavedPosition = (int)local_1c0;
  (this->super_QCommonListViewBase).batchSavedDeltaSeg = iVar23;
  (this->super_QCommonListViewBase).batchStartRow = iVar28 + 1;
  iVar21 = 0;
  if (iVar28 == info->max) {
    iVar21 = info->spacing;
  }
  local_1c0._0_4_ = (int)local_1c0 - iVar21;
  lVar22 = (this->segmentPositions).d.size;
  if (FVar16 == LeftToRight) {
    RVar25.m_i = (int)local_1c0;
    if (lVar22 != 1) {
      RVar25.m_i = (info->bounds).x2.m_i;
    }
    RVar26.m_i = iVar23 + (int)local_190;
  }
  else {
    RVar26.m_i = (int)local_1c0;
    if (lVar22 != 1) {
      RVar26.m_i = (info->bounds).y2.m_i;
    }
    RVar25.m_i = iVar23 + (int)local_190;
  }
  QVar20.ht.m_i = RVar26.m_i;
  QVar20.wd.m_i = RVar25.m_i;
  (this->super_QCommonListViewBase).contentsSize = QVar20;
  if (info->last == info->max) {
    local_128.xp.m_i = (int)local_1c0;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->segmentExtents,(this->segmentExtents).d.size,
               (int *)&local_128);
    QList<int>::end(&this->segmentExtents);
    local_128.xp.m_i = (int)(this->flowPositions).d.size;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->scrollValueMap,(this->scrollValueMap).d.size,
               (int *)&local_128);
    QList<int>::end(&this->scrollValueMap);
    local_128.xp.m_i = (int)local_1c0;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->flowPositions,(this->flowPositions).d.size,
               (int *)&local_128);
    QList<int>::end(&this->flowPositions);
    local_128.xp.m_i = 0x7fffffff;
    if (info->wrap != false) {
      local_128.xp.m_i = (int)local_190 + iVar23;
    }
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)&this->segmentPositions,(this->segmentPositions).d.size,
               (int *)&local_128);
    QList<int>::end(&this->segmentPositions);
  }
  uStack_120 = CONCAT44(RVar26.m_i,RVar25.m_i);
  local_128 = QVar17;
  local_148._0_16_ =
       QWidgetPrivate::clipRect((QWidgetPrivate *)(this->super_QCommonListViewBase).dd);
  cVar15 = QRect::intersects((QRect *)&local_148);
  if (cVar15 != '\0') {
    QWidget::update((((this->super_QCommonListViewBase).dd)->super_QAbstractItemViewPrivate).
                    super_QAbstractScrollAreaPrivate.viewport);
  }
  QBrush::~QBrush(&local_108.backgroundBrush);
  if (&(local_108.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QIcon::~QIcon(&local_108.icon);
  QLocale::~QLocale(&local_108.locale);
  QFont::~QFont(&local_108.font);
  QStyleOption::~QStyleOption(&local_108.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListModeViewBase::doStaticLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initStaticLayout(info);
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    option.rect = info.bounds;
    option.rect.adjust(info.spacing, info.spacing, -info.spacing, -info.spacing);

    // The static layout data structures are as follows:
    // One vector contains the coordinate in the direction of layout flow.
    // Another vector contains the coordinates of the segments.
    // A third vector contains the index (model row) of the first item
    // of each segment.

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left();
        segEndPosition = info.bounds.width();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.height(); // dy
        deltaSegHint = info.grid.height();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top();
        segEndPosition = info.bounds.height();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = useItemSize ? batchSavedDeltaSeg : info.grid.width(); // dx
        deltaSegHint = info.grid.width();
    }

    for (int row = info.first; row <= info.last; ++row) {
        if (isHidden(row)) { // ###
            flowPositions.append(flowPosition);
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                QSize hint = itemSize(option, modelIndex(row));
                if (info.flow == QListView::LeftToRight) {
                    deltaFlowPosition = hint.width() + info.spacing;
                    deltaSegHint = hint.height() + info.spacing;
                } else { // TopToBottom
                    deltaFlowPosition = hint.height() + info.spacing;
                    deltaSegHint = hint.width() + info.spacing;
                }
            }
            // create new segment
            if (info.wrap && (flowPosition + deltaFlowPosition >= segEndPosition)) {
                segmentExtents.append(flowPosition);
                flowPosition = info.spacing + segStartPosition;
                segPosition += info.spacing + deltaSegPosition;
                segmentPositions.append(segPosition);
                segmentStartRows.append(row);
                deltaSegPosition = 0;
            }
            // save the flow position of this item
            scrollValueMap.append(flowPositions.size());
            flowPositions.append(flowPosition);
            // prepare for the next item
            deltaSegPosition = qMax(deltaSegHint, deltaSegPosition);
            flowPosition += info.spacing + deltaFlowPosition;
        }
    }
    // used when laying out next batch
    batchSavedPosition = flowPosition;
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    if (info.last == info.max)
        flowPosition -= info.spacing; // remove extra spacing
    // set the contents size
    QRect rect = info.bounds;
    if (info.flow == QListView::LeftToRight) {
        rect.setRight(segmentPositions.size() == 1 ? flowPosition : info.bounds.right());
        rect.setBottom(segPosition + deltaSegPosition);
    } else { // TopToBottom
        rect.setRight(segPosition + deltaSegPosition);
        rect.setBottom(segmentPositions.size() == 1 ? flowPosition : info.bounds.bottom());
    }
    contentsSize = QSize(rect.right(), rect.bottom());
    // if it is the last batch, save the end of the segments
    if (info.last == info.max) {
        segmentExtents.append(flowPosition);
        scrollValueMap.append(flowPositions.size());
        flowPositions.append(flowPosition);
        segmentPositions.append(info.wrap ? segPosition + deltaSegPosition : INT_MAX);
    }
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}